

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_mul_62
               (secp256k1_modinv64_signed62 *r,secp256k1_modinv64_signed62 *a,int alen,
               int64_t factor)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  lVar8 = 0;
  lVar7 = 0;
  uVar6 = 0;
  do {
    if (lVar8 < alen) {
      uVar3 = factor * a->v[lVar8];
      uVar4 = SUB168(SEXT816(factor) * SEXT816(a->v[lVar8]),8);
      if ((long)uVar4 < 0) {
        lVar5 = (-0x8000000000000000 - uVar4) - (ulong)(uVar3 != 0);
        lVar2 = lVar7 - lVar5;
        if ((SBORROW8(lVar7,lVar5) != SBORROW8(lVar2,(ulong)(uVar6 < -uVar3))) ==
            (long)(lVar2 - (ulong)(uVar6 < -uVar3)) < 0) goto LAB_00119242;
      }
      else {
        lVar2 = (uVar4 ^ 0x7fffffffffffffff) - lVar7;
        if ((SBORROW8(uVar4 ^ 0x7fffffffffffffff,lVar7) != SBORROW8(lVar2,(ulong)(~uVar3 < uVar6)))
            == (long)(lVar2 - (ulong)(~uVar3 < uVar6)) < 0) {
LAB_00119242:
          bVar9 = CARRY8(uVar6,uVar3);
          uVar6 = uVar6 + uVar3;
          lVar7 = lVar7 + uVar4 + (ulong)bVar9;
          goto LAB_00119248;
        }
      }
      secp256k1_modinv64_mul_62_cold_3();
      goto LAB_001192ae;
    }
LAB_00119248:
    uVar3 = lVar7 << 2 | uVar6 >> 0x3e;
    r->v[lVar8] = uVar6 & 0x3fffffffffffffff;
    lVar7 = lVar7 >> 0x3e;
    lVar8 = lVar8 + 1;
    uVar6 = uVar3;
  } while (lVar8 != 4);
  if (4 < alen) {
    uVar6 = factor * a->v[4];
    bVar9 = CARRY8(uVar3,uVar6);
    uVar3 = uVar3 + uVar6;
    lVar7 = lVar7 + SUB168(SEXT816(factor) * SEXT816(a->v[4]),8) + (ulong)bVar9;
  }
  if (lVar7 + -1 + (ulong)(0x7fffffffffffffff < uVar3) == -1) {
    if (lVar7 == (long)uVar3 >> 0x3f) {
      r->v[4] = uVar3;
      return;
    }
  }
  else {
LAB_001192ae:
    secp256k1_modinv64_mul_62_cold_2();
  }
  secp256k1_modinv64_mul_62_cold_1();
  uVar1 = *(uint *)((long)a->v + 0x1c);
  r->v[0] = (ulong)(*(byte *)((long)a->v + 0x19) & 0xf) << 0x30 |
            (ulong)CONCAT15(*(undefined1 *)((long)a->v + 0x1a),
                            CONCAT14(*(undefined1 *)((long)a->v + 0x1b),
                                     uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                     | uVar1 << 0x18));
  r->v[1] = (ulong)*(byte *)((long)a->v + 0x13) << 0x2c |
            (ulong)*(byte *)((long)a->v + 0x14) << 0x24 |
            (ulong)*(byte *)((long)a->v + 0x15) << 0x1c |
            (ulong)((uint)*(byte *)((long)a->v + 0x16) << 0x14 |
                   (uint)*(byte *)((long)a->v + 0x17) << 0xc |
                   (uint)(byte)a->v[3] << 4 | (uint)(*(byte *)((long)a->v + 0x19) >> 4));
  uVar1 = *(uint *)((long)a->v + 0xf);
  r->v[2] = (ulong)(*(byte *)((long)a->v + 0xc) & 0xf) << 0x30 |
            (ulong)CONCAT15(*(undefined1 *)((long)a->v + 0xd),
                            CONCAT14(*(undefined1 *)((long)a->v + 0xe),
                                     uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                     | uVar1 << 0x18));
  r->v[3] = (ulong)*(byte *)((long)a->v + 6) << 0x2c |
            (ulong)*(byte *)((long)a->v + 7) << 0x24 |
            (ulong)(byte)a->v[1] << 0x1c |
            (ulong)((uint)*(byte *)((long)a->v + 9) << 0x14 |
                   (uint)*(byte *)((long)a->v + 10) << 0xc |
                   (uint)*(byte *)((long)a->v + 0xb) << 4 | (uint)(*(byte *)((long)a->v + 0xc) >> 4)
                   );
  uVar1 = *(uint *)((long)a->v + 2);
  r->v[4] = (ulong)CONCAT15((char)a->v[0],
                            CONCAT14(*(undefined1 *)((long)a->v + 1),
                                     uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                     | uVar1 << 0x18));
  return;
}

Assistant:

static void secp256k1_modinv64_mul_62(secp256k1_modinv64_signed62 *r, const secp256k1_modinv64_signed62 *a, int alen, int64_t factor) {
    const uint64_t M62 = UINT64_MAX >> 2;
    secp256k1_int128 c, d;
    int i;
    secp256k1_i128_from_i64(&c, 0);
    for (i = 0; i < 4; ++i) {
        if (i < alen) secp256k1_i128_accum_mul(&c, a->v[i], factor);
        r->v[i] = secp256k1_i128_to_u64(&c) & M62; secp256k1_i128_rshift(&c, 62);
    }
    if (4 < alen) secp256k1_i128_accum_mul(&c, a->v[4], factor);
    secp256k1_i128_from_i64(&d, secp256k1_i128_to_i64(&c));
    VERIFY_CHECK(secp256k1_i128_eq_var(&c, &d));
    r->v[4] = secp256k1_i128_to_i64(&c);
}